

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbyte.hpp
# Opt level: O1

void vbyte_encode_u32(uint8_t **out,uint32_t x)

{
  byte *pbVar1;
  byte bVar2;
  
  if (0x7f < x) {
    bVar2 = (byte)x | 0x80;
    if (x < 0x4000) {
      pbVar1 = *out;
      *out = pbVar1 + 1;
      *pbVar1 = bVar2;
      x = x >> 7;
    }
    else if (x < 0x200000) {
      pbVar1 = *out;
      *out = pbVar1 + 1;
      *pbVar1 = bVar2;
      pbVar1 = *out;
      *out = pbVar1 + 1;
      *pbVar1 = (byte)(x >> 7) | 0x80;
      x = x >> 0xe;
    }
    else {
      pbVar1 = *out;
      *out = pbVar1 + 1;
      *pbVar1 = bVar2;
      pbVar1 = *out;
      *out = pbVar1 + 1;
      *pbVar1 = (byte)(x >> 7) | 0x80;
      pbVar1 = *out;
      bVar2 = (byte)(x >> 0x15);
      *out = pbVar1 + 1;
      *pbVar1 = (byte)(x >> 0xe) | 0x80;
      if (x < 0x10000000) goto LAB_001208f7;
      pbVar1 = *out;
      *out = pbVar1 + 1;
      *pbVar1 = bVar2 | 0x80;
      x = x >> 0x1c;
    }
  }
  bVar2 = (byte)x;
LAB_001208f7:
  pbVar1 = *out;
  *out = pbVar1 + 1;
  *pbVar1 = bVar2;
  return;
}

Assistant:

void vbyte_encode_u32(uint8_t*& out, uint32_t x)
{
    if (x < (1U << 7)) {
        *out++ = static_cast<uint8_t>(x & 127);
    } else if (x < (1U << 14)) {
        *out++ = extract7bits<0>(x) | 128;
        *out++ = extract7bitsmaskless<1>(x) & 127;
    } else if (x < (1U << 21)) {
        *out++ = extract7bits<0>(x) | 128;
        *out++ = extract7bits<1>(x) | 128;
        *out++ = extract7bitsmaskless<2>(x) & 127;
    } else if (x < (1U << 28)) {
        *out++ = extract7bits<0>(x) | 128;
        *out++ = extract7bits<1>(x) | 128;
        *out++ = extract7bits<2>(x) | 128;
        *out++ = extract7bitsmaskless<3>(x) & 127;
    } else {
        *out++ = extract7bits<0>(x) | 128;
        *out++ = extract7bits<1>(x) | 128;
        *out++ = extract7bits<2>(x) | 128;
        *out++ = extract7bits<3>(x) | 128;
        *out++ = extract7bitsmaskless<4>(x) & 127;
    }
}